

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::ForNode::do_render(ForNode *this,ostringstream *out,shared_ptr<minja::Context> *context)

{
  bool bVar1;
  runtime_error *prVar2;
  function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)> *in_RDI;
  function<void_(minja::Value_&)> visit;
  CallableType loop_function;
  Value iterable_value;
  Value *in_stack_fffffffffffffee8;
  Value *this_00;
  anon_class_40_5_e1151638 *__f;
  function<void_(minja::Value_&)> *in_stack_ffffffffffffff00;
  anon_class_8_1_a8ca3c6b *in_stack_ffffffffffffff08;
  undefined1 local_98 [152];
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI[1]._M_invoker);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"ForNode.iterable is null");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI[2]._M_invoker);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"ForNode.body is null");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x31beb5);
  this_00 = (Value *)(local_98 + 0x20);
  Expression::evaluate
            ((Expression *)
             iterable_value.callable_.
             super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi,
             (shared_ptr<minja::Context> *)
             iterable_value.callable_.
             super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  __f = (anon_class_40_5_e1151638 *)local_98;
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>::
  function((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>
            *)this_00);
  std::function<void(minja::Value&)>::
  function<minja::ForNode::do_render(std::__cxx11::ostringstream&,std::shared_ptr<minja::Context>const&)const::_lambda(minja::Value&)_1_,void>
            (in_stack_ffffffffffffff00,__f);
  if ((in_RDI[3].super__Function_base._M_functor._M_pod_data[8] & 1U) != 0) {
    std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)>::
    operator=(in_RDI,in_stack_ffffffffffffff08);
  }
  std::function<void_(minja::Value_&)>::operator()
            ((function<void_(minja::Value_&)> *)this_00,in_stack_fffffffffffffee8);
  std::function<void_(minja::Value_&)>::~function((function<void_(minja::Value_&)> *)0x31bf8a);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>::
  ~function((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>
             *)0x31bf97);
  Value::~Value(this_00);
  return;
}

Assistant:

void do_render(std::ostringstream & out, const std::shared_ptr<Context> & context) const override {
      // https://jinja.palletsprojects.com/en/3.0.x/templates/#for
      if (!iterable) throw std::runtime_error("ForNode.iterable is null");
      if (!body) throw std::runtime_error("ForNode.body is null");

      auto iterable_value = iterable->evaluate(context);
      Value::CallableType loop_function;

      std::function<void(Value&)> visit = [&](Value& iter) {
          auto filtered_items = Value::array();
          if (!iter.is_null()) {
            if (!iterable_value.is_iterable()) {
              throw std::runtime_error("For loop iterable must be iterable: " + iterable_value.dump());
            }
            iterable_value.for_each([&](Value & item) {
                destructuring_assign(var_names, context, item);
                if (!condition || condition->evaluate(context).to_bool()) {
                  filtered_items.push_back(item);
                }
            });
          }
          if (filtered_items.empty()) {
            if (else_body) {
              else_body->render(out, context);
            }
          } else {
              auto loop = recursive ? Value::callable(loop_function) : Value::object();
              loop.set("length", (int64_t) filtered_items.size());

              size_t cycle_index = 0;
              loop.set("cycle", Value::callable([&](const std::shared_ptr<Context> &, ArgumentsValue & args) {
                  if (args.args.empty() || !args.kwargs.empty()) {
                      throw std::runtime_error("cycle() expects at least 1 positional argument and no named arg");
                  }
                  auto item = args.args[cycle_index];
                  cycle_index = (cycle_index + 1) % args.args.size();
                  return item;
              }));
              auto loop_context = Context::make(Value::object(), context);
              loop_context->set("loop", loop);
              for (size_t i = 0, n = filtered_items.size(); i < n; ++i) {
                  auto & item = filtered_items.at(i);
                  destructuring_assign(var_names, loop_context, item);
                  loop.set("index", (int64_t) i + 1);
                  loop.set("index0", (int64_t) i);
                  loop.set("revindex", (int64_t) (n - i));
                  loop.set("revindex0", (int64_t) (n - i - 1));
                  loop.set("length", (int64_t) n);
                  loop.set("first", i == 0);
                  loop.set("last", i == (n - 1));
                  loop.set("previtem", i > 0 ? filtered_items.at(i - 1) : Value());
                  loop.set("nextitem", i < n - 1 ? filtered_items.at(i + 1) : Value());
                  try {
                      body->render(out, loop_context);
                  } catch (const LoopControlException & e) {
                      if (e.control_type == LoopControlType::Break) break;
                      if (e.control_type == LoopControlType::Continue) continue;
                  }
              }
          }
      };

      if (recursive) {
        loop_function = [&](const std::shared_ptr<Context> &, ArgumentsValue & args) {
            if (args.args.size() != 1 || !args.kwargs.empty() || !args.args[0].is_array()) {
                throw std::runtime_error("loop() expects exactly 1 positional iterable argument");
            }
            auto & items = args.args[0];
            visit(items);
            return Value();
        };
      }

      visit(iterable_value);
  }